

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Controller.cpp
# Opt level: O0

void __thiscall Controller::~Controller(Controller *this)

{
  Bank *pBVar1;
  Boat *this_00;
  bool bVar2;
  reference ppPVar3;
  Person *p;
  iterator __end1;
  iterator __begin1;
  list<Person_*,_std::allocator<Person_*>_> *__range1;
  Controller *this_local;
  
  __end1 = std::__cxx11::list<Person_*,_std::allocator<Person_*>_>::begin(&this->players);
  p = (Person *)std::__cxx11::list<Person_*,_std::allocator<Person_*>_>::end(&this->players);
  while( true ) {
    bVar2 = std::operator!=(&__end1,(_Self *)&p);
    if (!bVar2) break;
    ppPVar3 = std::_List_iterator<Person_*>::operator*(&__end1);
    if (*ppPVar3 != (Person *)0x0) {
      (*(*ppPVar3)->_vptr_Person[3])();
    }
    std::_List_iterator<Person_*>::operator++(&__end1);
  }
  pBVar1 = this->leftSide;
  if (pBVar1 != (Bank *)0x0) {
    Bank::~Bank(pBVar1);
    operator_delete(pBVar1);
  }
  pBVar1 = this->rightSide;
  if (pBVar1 != (Bank *)0x0) {
    Bank::~Bank(pBVar1);
    operator_delete(pBVar1);
  }
  this_00 = this->boat;
  if (this_00 != (Boat *)0x0) {
    Boat::~Boat(this_00);
    operator_delete(this_00);
  }
  std::__cxx11::list<Person_*,_std::allocator<Person_*>_>::~list(&this->players);
  return;
}

Assistant:

Controller::~Controller() {
    // Removes every player
    for (Person* p : players)
        delete p;

    // Deletes the baks and boat
    delete leftSide;
    delete rightSide;
    delete boat;
}